

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void * __thiscall
google::protobuf::Reflection::MutableRawRepeatedField
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpptype,int ctype,
          Descriptor *desc)

{
  FieldType field_type;
  int number;
  bool bVar1;
  uint32_t uVar2;
  Nullable<const_char_*> failure_msg;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *pRVar3;
  char *description;
  char *method;
  Descriptor *descriptor;
  LogMessage local_40;
  Descriptor *local_30;
  
  local_30 = desc;
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    descriptor = this->descriptor_;
    if (field->containing_type_ == descriptor) {
      if ((*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != cpptype) &&
         ((cpptype != CPPTYPE_INT32 ||
          (*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) !=
           CPPTYPE_ENUM)))) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (descriptor,field,"MutableRawRepeatedField",cpptype);
      }
      if (desc != (Descriptor *)0x0) {
        local_40._0_8_ = FieldDescriptor::message_type(field);
        failure_msg = absl::lts_20250127::log_internal::
                      Check_EQImpl<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*>
                                ((Descriptor **)&local_40,&local_30,"field->message_type() == desc")
        ;
        if (failure_msg != (Nullable<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                     ,0xac7,failure_msg);
          absl::lts_20250127::log_internal::LogMessage::operator<<
                    (&local_40,(char (*) [22])"wrong submessage type");
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_40);
        }
      }
      if ((field->field_0x1 & 8) == 0) {
        bVar1 = FieldDescriptor::is_map(field);
        if (bVar1) {
          this_00 = MutableRawNonOneof<google::protobuf::internal::MapFieldBase>(this,message,field)
          ;
          pRVar3 = internal::MapFieldBase::MutableRepeatedField(this_00);
        }
        else {
          pRVar3 = (RepeatedPtrFieldBase *)MutableRawNonOneofImpl(this,message,field);
        }
      }
      else {
        uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        number = field->number_;
        field_type = field->type_;
        bVar1 = FieldDescriptor::is_packed(field);
        pRVar3 = (RepeatedPtrFieldBase *)
                 internal::ExtensionSet::MutableRawRepeatedField
                           ((ExtensionSet *)
                            ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                            number,field_type,bVar1,field);
      }
      return pRVar3;
    }
    method = "MutableRawRepeatedField";
    description = "Field does not match message type.";
  }
  else {
    descriptor = this->descriptor_;
    method = "\"MutableRawRepeatedField\"";
    description = "Field is singular; the method requires a repeated field.";
  }
  anon_unknown_6::ReportReflectionUsageError(descriptor,field,method,description);
}

Assistant:

void* Reflection::MutableRawRepeatedField(Message* message,
                                          const FieldDescriptor* field,
                                          FieldDescriptor::CppType cpptype,
                                          int ctype,
                                          const Descriptor* desc) const {
  (void)ctype;  // Parameter is used by Google-internal code.
  USAGE_CHECK_REPEATED("MutableRawRepeatedField");
  USAGE_CHECK_MESSAGE_TYPE(MutableRawRepeatedField);

  if (field->cpp_type() != cpptype &&
      (field->cpp_type() != FieldDescriptor::CPPTYPE_ENUM ||
       cpptype != FieldDescriptor::CPPTYPE_INT32))
    ReportReflectionUsageTypeError(descriptor_, field,
                                   "MutableRawRepeatedField", cpptype);
  if (desc != nullptr)
    ABSL_CHECK_EQ(field->message_type(), desc) << "wrong submessage type";
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    // Trigger transform for MapField
    if (IsMapFieldInApi(field)) {
      return MutableRawNonOneof<MapFieldBase>(message, field)
          ->MutableRepeatedField();
    }
    return MutableRawNonOneof<void>(message, field);
  }
}